

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

RPCHelpMan * wallet::getbalances(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  RPCHelpMan *in_RDI;
  undefined8 uVar7;
  long lVar8;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff478;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff47c;
  undefined8 in_stack_fffffffffffff488;
  undefined8 in_stack_fffffffffffff490;
  undefined8 in_stack_fffffffffffff498;
  code *pcVar10;
  undefined8 in_stack_fffffffffffff4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff4a8;
  pointer in_stack_fffffffffffff4b8;
  pointer pRVar11;
  pointer in_stack_fffffffffffff4c0;
  pointer pRVar12;
  pointer in_stack_fffffffffffff4c8;
  pointer pRVar13;
  undefined8 in_stack_fffffffffffff4d0;
  pointer pRVar14;
  pointer pRVar15;
  pointer pRVar16;
  undefined8 in_stack_fffffffffffff4f0;
  pointer pRVar17;
  pointer pRVar18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ae8;
  allocator_type local_ac9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ac8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_aa8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a88;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a68;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a50;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a38;
  RPCResults local_a20;
  vector<RPCArg,_std::allocator<RPCArg>_> local_a08;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  ulong *local_930;
  undefined8 local_928;
  ulong local_920;
  undefined8 uStack_918;
  ulong *local_910;
  size_type local_908;
  ulong local_900;
  undefined8 uStack_8f8;
  long *local_8f0 [2];
  long local_8e0 [2];
  long *local_8d0 [2];
  long local_8c0 [2];
  long *local_8b0 [2];
  long local_8a0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_890;
  long *local_870 [2];
  long local_860 [2];
  pointer local_850 [2];
  undefined1 local_840 [152];
  RPCResult local_7a8;
  RPCResult local_720;
  long *local_698 [2];
  long local_688 [2];
  long *local_678 [2];
  long local_668 [2];
  long *local_658 [2];
  long local_648 [2];
  long *local_638 [2];
  long local_628 [2];
  long *local_618 [2];
  long local_608 [2];
  long *local_5f8 [2];
  long local_5e8 [2];
  long *local_5d8 [2];
  long local_5c8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_5b8;
  long *local_598 [2];
  long local_588 [2];
  pointer local_578 [2];
  undefined1 local_568 [152];
  RPCResult local_4d0;
  RPCResult local_448;
  undefined1 local_3c0 [136];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  RPCResult local_2f8;
  RPCResult local_270;
  RPCResult local_1e8;
  long *local_160 [2];
  long local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  RPCResult local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_type *local_78;
  size_type local_70;
  size_type local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getbalances","");
  std::operator+(&local_98,"Returns an object with all balances in ",&::CURRENCY_UNIT_abi_cxx11_);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_98,".\n");
  local_78 = &local_68;
  psVar1 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar6) {
    local_68 = paVar6->_M_allocated_capacity;
    uStack_60 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_68 = paVar6->_M_allocated_capacity;
    local_78 = psVar1;
  }
  local_70 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_140[0] = local_130;
  local_a08.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a08.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a08.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"");
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"mine","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"balances from outputs that the wallet can sign","");
  local_578[0] = (pointer)local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"trusted","");
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_598,
             "trusted balance (outputs created by the wallet or confirmed outputs)","");
  local_a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff478;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff490;
  description._M_string_length = in_stack_fffffffffffff4a0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description.field_2 = in_stack_fffffffffffff4a8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff4c0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff4b8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff4c8;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_568 + 0x10),STR_AMOUNT,m_key_name,description,inner,
             SUB81(local_578,0));
  local_5b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_5b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"untrusted_pending","");
  local_5d8[0] = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d8,
             "untrusted pending balance (outputs created by others that are in the mempool)","");
  local_a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff478;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff490;
  description_00._M_string_length = in_stack_fffffffffffff4a0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_00.field_2 = in_stack_fffffffffffff4a8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  ::RPCResult::RPCResult
            (&local_4d0,STR_AMOUNT,m_key_name_00,description_00,inner_00,SUB81(&local_5b8,0));
  local_5f8[0] = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"immature","");
  local_618[0] = local_608;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_618,"balance from immature coinbase outputs","");
  local_aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff478;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff490;
  description_01._M_string_length = in_stack_fffffffffffff4a0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_01.field_2 = in_stack_fffffffffffff4a8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  ::RPCResult::RPCResult
            (&local_448,STR_AMOUNT,m_key_name_01,description_01,inner_01,SUB81(local_5f8,0));
  local_638[0] = local_628;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_638,"used","");
  local_658[0] = local_648;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_658,
             "(only present if avoid_reuse is set) balance from coins sent to addresses that were previously spent from (potentially privacy violating)"
             ,"");
  local_ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = in_stack_fffffffffffff47c;
  auVar3._12_8_ = in_stack_fffffffffffff488;
  auVar3._20_8_ = in_stack_fffffffffffff490;
  auVar3._28_4_ = 0;
  description_02._M_string_length = in_stack_fffffffffffff4a0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_02.field_2 = in_stack_fffffffffffff4a8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  ::RPCResult::RPCResult
            ((RPCResult *)local_3c0,STR_AMOUNT,(string)(auVar3 << 0x20),SUB81(local_638,0),
             description_02,inner_02,true);
  __l._M_len = 4;
  __l._M_array = (iterator)(local_568 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_a50,__l,&local_ac9);
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff490;
  description_03._M_string_length = in_stack_fffffffffffff4a0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_03.field_2 = in_stack_fffffffffffff4a8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  ::RPCResult::RPCResult(&local_2f8,OBJ,m_key_name_02,description_03,inner_03,SUB81(local_318,0));
  local_678[0] = local_668;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"watchonly","");
  local_698[0] = local_688;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_698,
             "watchonly balances (not present if wallet does not watch anything)","");
  local_850[0] = (pointer)local_840;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_850,"trusted","");
  local_870[0] = local_860;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_870,
             "trusted balance (outputs created by the wallet or confirmed outputs)","");
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff490;
  description_04._M_string_length = in_stack_fffffffffffff4a0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_04.field_2 = in_stack_fffffffffffff4a8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_840 + 0x10),STR_AMOUNT,m_key_name_03,description_04,inner_04,
             SUB81(local_850,0));
  local_890.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_890.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"untrusted_pending","");
  local_8b0[0] = local_8a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8b0,
             "untrusted pending balance (outputs created by others that are in the mempool)","");
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff490;
  description_05._M_string_length = in_stack_fffffffffffff4a0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_05.field_2 = in_stack_fffffffffffff4a8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  ::RPCResult::RPCResult
            (&local_7a8,STR_AMOUNT,m_key_name_04,description_05,inner_05,SUB81(&local_890,0));
  local_8d0[0] = local_8c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"immature","");
  local_8f0[0] = local_8e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8f0,"balance from immature coinbase outputs","");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff490;
  description_06._M_string_length = in_stack_fffffffffffff4a0;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_06.field_2 = in_stack_fffffffffffff4a8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ::RPCResult::RPCResult
            (&local_720,STR_AMOUNT,m_key_name_05,description_06,inner_06,SUB81(local_8d0,0));
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)(local_840 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_ae8,__l_00,(allocator_type *)&stack0xfffffffffffff4b7);
  uVar9 = 0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_fffffffffffff47c;
  auVar4._12_8_ = in_stack_fffffffffffff488;
  auVar4._20_8_ = in_stack_fffffffffffff490;
  auVar4._28_4_ = 0;
  description_07._M_string_length = in_stack_fffffffffffff4a0;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_07.field_2._M_local_buf = in_stack_fffffffffffff4a8._M_local_buf;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar12;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar11;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  ::RPCResult::RPCResult
            (&local_270,OBJ,(string)(auVar4 << 0x20),SUB81(local_678,0),description_07,inner_07,true
            );
  ::RPCResult::RPCResult(&local_1e8,(RPCResult *)RESULT_LAST_PROCESSED_BLOCK);
  __l_01._M_len = 3;
  __l_01._M_array = &local_2f8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_a38,__l_01,(allocator_type *)&stack0xfffffffffffff4b6);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff490;
  description_08._M_string_length = in_stack_fffffffffffff4a0;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_08.field_2 = in_stack_fffffffffffff4a8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar12;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar11;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  ::RPCResult::RPCResult(&local_120,OBJ,m_key_name_06,description_08,inner_08,SUB81(local_140,0));
  result._4_4_ = in_stack_fffffffffffff47c;
  result.m_type = uVar9;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff488;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff490;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff498;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4a0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff4a8;
  result._64_8_ = pRVar11;
  result.m_description._M_dataplus._M_p = (pointer)pRVar12;
  result.m_description._M_string_length = (size_type)pRVar13;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff4d0;
  result.m_description.field_2._8_8_ = pRVar14;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar15;
  result.m_cond._M_string_length = (size_type)pRVar16;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff4f0;
  result.m_cond.field_2._8_8_ = pRVar17;
  RPCResults::RPCResults(&local_a20,result);
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"getbalances","");
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"");
  HelpExampleCli(&local_950,&local_970,&local_990);
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"getbalances","");
  local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f0,"");
  HelpExampleRpc(&local_9b0,&local_9d0,&local_9f0);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    uVar7 = local_950.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_9b0._M_string_length + local_950._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
      uVar7 = local_9b0.field_2._M_allocated_capacity;
    }
    if (local_9b0._M_string_length + local_950._M_string_length <= (ulong)uVar7) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_9b0,0,0,local_950._M_dataplus._M_p,local_950._M_string_length);
      goto LAB_005ddc95;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_950,local_9b0._M_dataplus._M_p,local_9b0._M_string_length);
LAB_005ddc95:
  local_930 = &local_920;
  puVar2 = (ulong *)(pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar6) {
    local_920 = paVar6->_M_allocated_capacity;
    uStack_918 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_920 = paVar6->_M_allocated_capacity;
    local_930 = puVar2;
  }
  local_908 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  paVar6->_M_local_buf[0] = '\0';
  if (local_930 == &local_920) {
    uStack_8f8 = uStack_918;
    local_910 = &local_900;
  }
  else {
    local_910 = local_930;
  }
  local_900 = local_920;
  local_928 = 0;
  local_920 = local_920 & 0xffffffffffffff00;
  pcVar10 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/coins.cpp:455:9)>
            ::_M_manager;
  description_09._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/coins.cpp:455:9)>
       ::_M_invoke;
  description_09._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/coins.cpp:455:9)>
                ::_M_manager;
  description_09.field_2 = in_stack_fffffffffffff4a8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar12;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar11;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar13;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4d0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar15;
  examples.m_examples._M_string_length = in_stack_fffffffffffff4f0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar16;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar17;
  examples.m_examples.field_2._8_8_ = pRVar18;
  local_930 = &local_920;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff488)),description_09,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar10 != (code *)0x0) {
    (*pcVar10)(&stack0xfffffffffffff488,&stack0xfffffffffffff488,3);
  }
  if (local_910 != &local_900) {
    operator_delete(local_910,local_900 + 1);
  }
  if (local_930 != &local_920) {
    operator_delete(local_930,local_920 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
    operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a20.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.m_cond._M_dataplus._M_p != &local_120.m_cond.field_2) {
    operator_delete(local_120.m_cond._M_dataplus._M_p,
                    local_120.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.m_description._M_dataplus._M_p != &local_120.m_description.field_2) {
    operator_delete(local_120.m_description._M_dataplus._M_p,
                    local_120.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_120.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.m_key_name._M_dataplus._M_p != &local_120.m_key_name.field_2) {
    operator_delete(local_120.m_key_name._M_dataplus._M_p,
                    local_120.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a38);
  lVar8 = 0x198;
  do {
    if ((long *)((long)local_308 + lVar8) != *(long **)((long)local_318 + lVar8)) {
      operator_delete(*(long **)((long)local_318 + lVar8),*(long *)((long)local_308 + lVar8) + 1);
    }
    if ((long *)((long)local_328 + lVar8) != *(long **)((long)local_338 + lVar8)) {
      operator_delete(*(long **)((long)local_338 + lVar8),*(long *)((long)local_328 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_3c0 + lVar8 + 0x68));
    if ((long *)(local_3c0 + lVar8 + 0x58) != *(long **)(local_3c0 + lVar8 + 0x48)) {
      operator_delete(*(long **)(local_3c0 + lVar8 + 0x48),*(long *)(local_3c0 + lVar8 + 0x58) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ae8);
  lVar8 = 0x198;
  do {
    if ((long *)(local_840 + lVar8) != *(long **)((long)local_850 + lVar8)) {
      operator_delete(*(long **)((long)local_850 + lVar8),*(long *)(local_840 + lVar8) + 1);
    }
    if ((long *)((long)local_860 + lVar8) != *(long **)((long)local_870 + lVar8)) {
      operator_delete(*(long **)((long)local_870 + lVar8),*(long *)((long)local_860 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_890.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar8));
    if ((long *)((long)local_8a0 + lVar8) != *(long **)((long)local_8b0 + lVar8)) {
      operator_delete(*(long **)((long)local_8b0 + lVar8),*(long *)((long)local_8a0 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4b8);
  if (local_8f0[0] != local_8e0) {
    operator_delete(local_8f0[0],local_8e0[0] + 1);
  }
  if (local_8d0[0] != local_8c0) {
    operator_delete(local_8d0[0],local_8c0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4d8);
  if (local_8b0[0] != local_8a0) {
    operator_delete(local_8b0[0],local_8a0[0] + 1);
  }
  if (local_890.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_890.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_890.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_890.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4f8);
  if (local_870[0] != local_860) {
    operator_delete(local_870[0],local_860[0] + 1);
  }
  if (local_850[0] != (pointer)local_840) {
    operator_delete(local_850[0],local_840._0_8_ + 1);
  }
  if (local_698[0] != local_688) {
    operator_delete(local_698[0],local_688[0] + 1);
  }
  if (local_678[0] != local_668) {
    operator_delete(local_678[0],local_668[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a50);
  lVar8 = 0x220;
  do {
    if ((long *)(local_568 + lVar8) != *(long **)((long)local_578 + lVar8)) {
      operator_delete(*(long **)((long)local_578 + lVar8),*(long *)(local_568 + lVar8) + 1);
    }
    if ((long *)((long)local_588 + lVar8) != *(long **)((long)local_598 + lVar8)) {
      operator_delete(*(long **)((long)local_598 + lVar8),*(long *)((long)local_588 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_5b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar8));
    if ((long *)((long)local_5c8 + lVar8) != *(long **)((long)local_5d8 + lVar8)) {
      operator_delete(*(long **)((long)local_5d8 + lVar8),*(long *)((long)local_5c8 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ac8);
  if (local_658[0] != local_648) {
    operator_delete(local_658[0],local_648[0] + 1);
  }
  if (local_638[0] != local_628) {
    operator_delete(local_638[0],local_628[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_aa8);
  if (local_618[0] != local_608) {
    operator_delete(local_618[0],local_608[0] + 1);
  }
  if (local_5f8[0] != local_5e8) {
    operator_delete(local_5f8[0],local_5e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a88);
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if (local_5b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_5b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_5b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_5b8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a68);
  if (local_598[0] != local_588) {
    operator_delete(local_598[0],local_588[0] + 1);
  }
  if (local_578[0] != (pointer)local_568) {
    operator_delete(local_578[0],local_568._0_8_ + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  if (local_160[0] != local_150) {
    operator_delete(local_160[0],local_150[0] + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_a08);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getbalances()
{
    return RPCHelpMan{
        "getbalances",
        "Returns an object with all balances in " + CURRENCY_UNIT + ".\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::OBJ, "mine", "balances from outputs that the wallet can sign",
                {
                    {RPCResult::Type::STR_AMOUNT, "trusted", "trusted balance (outputs created by the wallet or confirmed outputs)"},
                    {RPCResult::Type::STR_AMOUNT, "untrusted_pending", "untrusted pending balance (outputs created by others that are in the mempool)"},
                    {RPCResult::Type::STR_AMOUNT, "immature", "balance from immature coinbase outputs"},
                    {RPCResult::Type::STR_AMOUNT, "used", /*optional=*/true, "(only present if avoid_reuse is set) balance from coins sent to addresses that were previously spent from (potentially privacy violating)"},
                }},
                {RPCResult::Type::OBJ, "watchonly", /*optional=*/true, "watchonly balances (not present if wallet does not watch anything)",
                {
                    {RPCResult::Type::STR_AMOUNT, "trusted", "trusted balance (outputs created by the wallet or confirmed outputs)"},
                    {RPCResult::Type::STR_AMOUNT, "untrusted_pending", "untrusted pending balance (outputs created by others that are in the mempool)"},
                    {RPCResult::Type::STR_AMOUNT, "immature", "balance from immature coinbase outputs"},
                }},
                RESULT_LAST_PROCESSED_BLOCK,
            }
            },
        RPCExamples{
            HelpExampleCli("getbalances", "") +
            HelpExampleRpc("getbalances", "")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> rpc_wallet = GetWalletForJSONRPCRequest(request);
    if (!rpc_wallet) return UniValue::VNULL;
    const CWallet& wallet = *rpc_wallet;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    LOCK(wallet.cs_wallet);

    const auto bal = GetBalance(wallet);
    UniValue balances{UniValue::VOBJ};
    {
        UniValue balances_mine{UniValue::VOBJ};
        balances_mine.pushKV("trusted", ValueFromAmount(bal.m_mine_trusted));
        balances_mine.pushKV("untrusted_pending", ValueFromAmount(bal.m_mine_untrusted_pending));
        balances_mine.pushKV("immature", ValueFromAmount(bal.m_mine_immature));
        if (wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE)) {
            // If the AVOID_REUSE flag is set, bal has been set to just the un-reused address balance. Get
            // the total balance, and then subtract bal to get the reused address balance.
            const auto full_bal = GetBalance(wallet, 0, false);
            balances_mine.pushKV("used", ValueFromAmount(full_bal.m_mine_trusted + full_bal.m_mine_untrusted_pending - bal.m_mine_trusted - bal.m_mine_untrusted_pending));
        }
        balances.pushKV("mine", std::move(balances_mine));
    }
    auto spk_man = wallet.GetLegacyScriptPubKeyMan();
    if (spk_man && spk_man->HaveWatchOnly()) {
        UniValue balances_watchonly{UniValue::VOBJ};
        balances_watchonly.pushKV("trusted", ValueFromAmount(bal.m_watchonly_trusted));
        balances_watchonly.pushKV("untrusted_pending", ValueFromAmount(bal.m_watchonly_untrusted_pending));
        balances_watchonly.pushKV("immature", ValueFromAmount(bal.m_watchonly_immature));
        balances.pushKV("watchonly", std::move(balances_watchonly));
    }

    AppendLastProcessedBlock(balances, wallet);
    return balances;
},
    };
}